

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,string *text)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  code *pcVar4;
  ulong uVar5;
  long *plVar6;
  Buffer *pBVar7;
  ulong uVar8;
  string padding;
  Buffer buffers [2];
  
  if (text->_M_string_length != 0) {
    buffers[0].collected._M_dataplus._M_p = (pointer)&buffers[0].collected.field_2;
    buffers[0].collected._M_string_length = 0;
    buffers[0].collected.field_2._M_local_buf[0] = '\0';
    buffers[0].printer = (PrinterFn)PrintParagraph;
    buffers[0]._40_8_ = 0;
    buffers[1].collected._M_dataplus._M_p = (pointer)&buffers[1].collected.field_2;
    buffers[1].collected._M_string_length = 0;
    buffers[1].collected.field_2._M_local_buf[0] = '\0';
    buffers[1].printer = (PrinterFn)PrintPreformatted;
    buffers[1]._40_8_ = 0;
    padding._M_dataplus._M_p = (pointer)&padding.field_2;
    std::__cxx11::string::_M_construct((ulong)&padding,(char)this->TextIndent);
    uVar5 = 0;
    while (uVar5 < text->_M_string_length) {
      cVar1 = (text->_M_dataplus)._M_p[uVar5];
      uVar8 = (ulong)(cVar1 == ' ');
      uVar2 = uVar8 ^ 1;
      if (buffers[uVar2].collected._M_string_length != 0) {
        if (buffers[uVar8].collected._M_string_length != 0) {
          __assert_fail("buffers[current_idx].collected.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                        ,0x46,
                        "void cmDocumentationFormatter::PrintFormatted(std::ostream &, const std::string &) const"
                       );
        }
        pcVar4 = (code *)buffers[uVar2].printer;
        plVar6 = (long *)((long)&this->TextWidth + *(long *)&buffers[uVar2].field_0x28);
        if (((ulong)pcVar4 & 1) != 0) {
          pcVar4 = *(code **)(pcVar4 + *plVar6 + -1);
        }
        (*pcVar4)(plVar6,os,buffers + uVar2);
        buffers[uVar2].collected._M_string_length = 0;
        *buffers[uVar2].collected._M_dataplus._M_p = '\0';
      }
      pBVar7 = buffers + uVar8;
      if ((cVar1 != ' ') && (buffers[uVar8].collected._M_string_length != 0)) {
        std::__cxx11::string::push_back((char)pBVar7);
      }
      lVar3 = std::__cxx11::string::find((char)text,10);
      if (cVar1 == ' ') {
        std::__cxx11::string::append((string *)pBVar7);
      }
      uVar2 = lVar3 + 1U;
      if (lVar3 + 1U == 0) {
        uVar2 = 0xffffffffffffffff;
      }
      std::__cxx11::string::append((string *)pBVar7,(ulong)text,uVar5);
      uVar5 = uVar2;
    }
    for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x30) {
      if (*(long *)((long)&buffers[0].collected._M_string_length + lVar3) != 0) {
        pcVar4 = *(code **)((long)&buffers[0].printer + lVar3);
        plVar6 = (long *)((long)&this->TextWidth + *(long *)(&buffers[0].field_0x28 + lVar3));
        if (((ulong)pcVar4 & 1) != 0) {
          pcVar4 = *(code **)(pcVar4 + *plVar6 + -1);
        }
        (*pcVar4)(plVar6,os,(long)&buffers[0].collected._M_dataplus._M_p + lVar3);
      }
    }
    std::__cxx11::string::~string((string *)&padding);
    lVar3 = 0x30;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&buffers[0].collected._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x30);
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              std::string const& text) const
{
  if (text.empty()) {
    return;
  }

  struct Buffer
  {
    // clang-format off
    using PrinterFn = void (cmDocumentationFormatter::*)(
        std::ostream&, std::string const&
      ) const;
    // clang-format on
    std::string collected;
    const PrinterFn printer;
  };
  // const auto NORMAL_IDX = 0u;
  const auto PREFORMATTED_IDX = 1u;
  const auto HANDLERS_SIZE = 2u;
  Buffer buffers[HANDLERS_SIZE] = {
    { {}, &cmDocumentationFormatter::PrintParagraph },
    { {}, &cmDocumentationFormatter::PrintPreformatted }
  };

  const auto padding = std::string(this->TextIndent, ' ');

  for (std::size_t pos = 0u, eol = 0u; pos < text.size(); pos = eol) {
    const auto current_idx = std::size_t(text[pos] == ' ');
    // size_t(!bool(current_idx))
    const auto other_idx = current_idx ^ 1u;

    // Flush the other buffer if anything has been collected
    if (!buffers[other_idx].collected.empty()) {
      // NOTE Whatever the other index is, the current buffered
      // string expected to be empty.
      assert(buffers[current_idx].collected.empty());

      (this->*buffers[other_idx].printer)(os, buffers[other_idx].collected);
      buffers[other_idx].collected.clear();
    }

    // ATTENTION The previous implementation had called `PrintParagraph()`
    // **for every processed (char by char) input line**.
    // The method unconditionally append the `\n' character after the
    // printed text. To keep the backward-compatible behavior it's needed to
    // add the '\n' character to the previously collected line...
    if (!buffers[current_idx].collected.empty() &&
        current_idx != PREFORMATTED_IDX) {
      buffers[current_idx].collected += '\n';
    }

    // Lookup EOL
    eol = text.find('\n', pos);
    if (current_idx == PREFORMATTED_IDX) {
      buffers[current_idx].collected.append(padding);
    }
    buffers[current_idx].collected.append(
      text, pos, eol == std::string::npos ? eol : ++eol - pos);
  }

  for (auto& buf : buffers) {
    if (!buf.collected.empty()) {
      (this->*buf.printer)(os, buf.collected);
    }
  }
}